

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O3

bool __thiscall json::SaveObject::process<bool>(SaveObject *this,char *name,bool *t)

{
  char *pcVar1;
  ostream *poVar2;
  size_t sVar3;
  int iVar4;
  char local_2b [3];
  
  if (this->first == true) {
    this->first = false;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(this->out,",\n",2);
  }
  if (0 < this->tabs) {
    iVar4 = 0;
    do {
      local_2b[0] = '\t';
      std::__ostream_insert<char,std::char_traits<char>>(this->out,local_2b,1);
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->tabs);
  }
  local_2b[1] = 0x22;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(this->out,local_2b + 1,1);
  if (name == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,name,sVar3);
  }
  local_2b[2] = 0x22;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_2b + 2,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  pcVar1 = "v.val == false";
  if ((ulong)*t != 0) {
    pcVar1 = "v.val == true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->out,pcVar1 + 9,(ulong)*t ^ 5);
  return ((byte)this->out[*(long *)(*(long *)this->out + -0x18) + 0x20] & 5) == 0;
}

Assistant:

bool process(const char* name, T& t) {
		if (first)
			first = false;
		else
			out << ",\n";
		for (int i = 0; i < tabs; ++i) out << '\t';
		out << quote << name << quote << ": ";
		save(out, t, tabs);
		if (out.fail())
			return false;
		return true;
	}